

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_vote.cxx
# Opt level: O2

void __thiscall nuraft::raft_server::initiate_vote(raft_server *this,bool force_vote)

{
  uint uVar1;
  __int_type _Var2;
  element_type *peVar3;
  bool bVar4;
  int iVar5;
  int32 iVar6;
  uint64_t uVar7;
  _Alloc_hider local_50;
  
  nuraft::context::get_params((context *)&stack0xffffffffffffffb0);
  uVar1 = *(uint *)&((element_type *)(local_50._M_p + 0x60))->_vptr_state_mgr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffb8);
  _Var2 = (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ->term_).super___atomic_base<unsigned_long>._M_i;
  if ((uVar1 != 0 && !force_vote) &&
     ((this->sm_commit_index_).super___atomic_base<unsigned_long>._M_i <
      (this->lagging_sm_target_index_).super___atomic_base<unsigned_long>._M_i)) {
    peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar3 != (element_type *)0x0) && (iVar5 = (*peVar3->_vptr_logger[7])(), 3 < iVar5)) {
      peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)&stack0xffffffffffffffb0,
                 "grace period option is enabled, and state machine needs catch-up: %lu vs. %lu",
                 (this->sm_commit_index_).super___atomic_base<unsigned_long>._M_i,
                 (this->lagging_sm_target_index_).super___atomic_base<unsigned_long>._M_i);
      (*peVar3->_vptr_logger[8])
                (peVar3,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                 ,"initiate_vote",0xae,(string *)&stack0xffffffffffffffb0);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
    }
    if ((this->vote_init_timer_term_).super___atomic_base<unsigned_long>._M_i != _Var2) {
      peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar3 != (element_type *)0x0) && (iVar5 = (*peVar3->_vptr_logger[7])(), 3 < iVar5)) {
        peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)&stack0xffffffffffffffb0,
                   "grace period: %d, term increment detected %lu vs. %lu, reset timer",(ulong)uVar1
                   ,(this->vote_init_timer_term_).super___atomic_base<unsigned_long>._M_i,_Var2);
        (*peVar3->_vptr_logger[8])
                  (peVar3,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                   ,"initiate_vote",0xb2,(string *)&stack0xffffffffffffffb0);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
      }
      timer_helper::set_duration_ms(&this->vote_init_timer_,(long)(int)uVar1);
      timer_helper::reset(&this->vote_init_timer_);
      LOCK();
      (this->vote_init_timer_term_).super___atomic_base<unsigned_long>._M_i = _Var2;
      UNLOCK();
    }
    if ((this->vote_init_timer_term_).super___atomic_base<unsigned_long>._M_i == _Var2) {
      bVar4 = timer_helper::timeout(&this->vote_init_timer_);
      if (!bVar4) {
        peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar3 == (element_type *)0x0) {
          return;
        }
        iVar5 = (*peVar3->_vptr_logger[7])();
        if (iVar5 < 4) {
          return;
        }
        peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        uVar7 = timer_helper::get_ms(&this->vote_init_timer_);
        msg_if_given_abi_cxx11_
                  ((string *)&stack0xffffffffffffffb0,
                   "grace period: %d, term %lu, waited %lu ms, skip initiating vote",(ulong)uVar1,
                   _Var2,uVar7);
        (*peVar3->_vptr_logger[8])
                  (peVar3,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                   ,"initiate_vote",0xbd,(string *)&stack0xffffffffffffffb0);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
        return;
      }
    }
    peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar3 != (element_type *)0x0) && (iVar5 = (*peVar3->_vptr_logger[7])(), 3 < iVar5)) {
      peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar7 = timer_helper::get_ms(&this->vote_init_timer_);
      msg_if_given_abi_cxx11_
                ((string *)&stack0xffffffffffffffb0,
                 "grace period: %d, no new leader detected for term %lu for %lu ms",(ulong)uVar1,
                 _Var2,uVar7);
      (*peVar3->_vptr_logger[8])
                (peVar3,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                 ,"initiate_vote",0xc3,(string *)&stack0xffffffffffffffb0);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
    }
  }
  if (((this->target_priority_ <= this->my_priority_ || force_vote) ||
      (bVar4 = check_cond_for_zp_election(this), bVar4)) ||
     (iVar6 = get_quorum_for_election(this), iVar6 == 0)) {
    srv_state::inc_term((this->state_).
                        super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    LOCK();
    (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    voted_for_).super___atomic_base<int>._M_i = -1;
    UNLOCK();
    LOCK();
    (this->role_)._M_i = candidate;
    UNLOCK();
    this->votes_responded_ = 0;
    this->votes_granted_ = 0;
    this->election_completed_ = false;
    request_vote(this,force_vote);
  }
  if ((this->role_)._M_i != leader) {
    LOCK();
    (this->hb_alive_)._M_base._M_i = false;
    UNLOCK();
    LOCK();
    (this->leader_).super___atomic_base<int>._M_i = -1;
    UNLOCK();
  }
  return;
}

Assistant:

void raft_server::initiate_vote(bool force_vote) {
    int grace_period = ctx_->get_params()->grace_period_of_lagging_state_machine_;
    ulong cur_term = state_->get_term();
    if ( !force_vote &&
         grace_period &&
         sm_commit_index_ < lagging_sm_target_index_ ) {
        p_in("grace period option is enabled, and state machine needs catch-up: "
             "%" PRIu64 " vs. %" PRIu64 "",
             sm_commit_index_.load(),
             lagging_sm_target_index_.load());
        if (vote_init_timer_term_ != cur_term) {
            p_in("grace period: %d, term increment detected %" PRIu64 " vs. %" PRIu64
                 ", reset timer",
                grace_period, vote_init_timer_term_.load(), cur_term);
            vote_init_timer_.set_duration_ms(grace_period);
            vote_init_timer_.reset();
            vote_init_timer_term_ = cur_term;
        }

        if ( vote_init_timer_term_ == cur_term &&
             !vote_init_timer_.timeout() ) {
            // Grace period, do not initiate vote.
            p_in("grace period: %d, term %" PRIu64 ", waited %" PRIu64
                 " ms, skip initiating vote",
                 grace_period, cur_term, vote_init_timer_.get_ms());
            return;

        } else {
            p_in("grace period: %d, no new leader detected for term %" PRIu64
                 " for %" PRIu64 " ms",
                 grace_period, cur_term, vote_init_timer_.get_ms());
        }
    }

    if ( my_priority_ >= target_priority_ ||
         force_vote ||
         check_cond_for_zp_election() ||
         get_quorum_for_election() == 0 ) {
        // Request vote when
        //  1) my priority satisfies the target, OR
        //  2) I'm the only node in the group.
        state_->inc_term();
        state_->set_voted_for(-1);
        role_ = srv_role::candidate;
        votes_granted_ = 0;
        votes_responded_ = 0;
        election_completed_ = false;
        // NOTE: Following `request_vote` will call `save_state()`,
        //       hence we don't call it here even though `state_` changes.
        request_vote(force_vote);
    }

    if (role_ != srv_role::leader) {
        hb_alive_ = false;
        leader_ = -1;
    }
}